

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_do_button_symbol(nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_symbol_type symbol,
                       nk_button_behavior behavior,nk_style_button *style,nk_input *in,
                       nk_user_font *font)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  nk_rect r;
  float in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  nk_user_font *in_RDI;
  nk_rect *in_R8;
  undefined8 in_R9;
  nk_button_behavior in_XMM0_Db;
  nk_input *in_XMM1_Qa;
  long in_stack_00000008;
  nk_rect content;
  int ret;
  nk_rect *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa8;
  nk_symbol_type in_stack_ffffffffffffffac;
  nk_style_button *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 uVar5;
  undefined4 uVar6;
  nk_flags local_4;
  
  uVar5 = (undefined4)in_R9;
  uVar6 = (undefined4)((ulong)in_R9 >> 0x20);
  if ((((in_RSI == 0) || (in_R8 == (nk_rect *)0x0)) || (in_stack_00000008 == 0)) ||
     (in_RDI == (nk_user_font *)0x0)) {
    local_4 = 0;
  }
  else {
    r._4_8_ = in_R8;
    r.x = (float)uVar6;
    r.h = in_ECX;
    local_4 = nk_do_button((nk_flags *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                           ,(nk_command_buffer *)in_stack_ffffffffffffffb0,r,
                           (nk_style_button *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_XMM1_Qa,
                           in_XMM0_Db,in_stack_ffffffffffffff90);
    lVar1._0_4_ = in_R8[10].x;
    lVar1._4_4_ = in_R8[10].y;
    if (lVar1 != 0) {
      uVar2._0_4_ = in_R8[9].w;
      uVar2._4_4_ = in_R8[9].h;
      (**(code **)(in_R8 + 10))(in_RSI,uVar2);
    }
    nk_draw_button_symbol
              ((nk_command_buffer *)CONCAT44(in_EDX,in_ECX),in_R8,(nk_rect *)CONCAT44(uVar6,uVar5),
               local_4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_RDI);
    lVar3._0_4_ = in_R8[10].w;
    lVar3._4_4_ = in_R8[10].h;
    if (lVar3 != 0) {
      uVar4._0_4_ = in_R8[9].w;
      uVar4._4_4_ = in_R8[9].h;
      (**(code **)&in_R8[10].w)(in_RSI,uVar4);
    }
  }
  return local_4;
}

Assistant:

NK_INTERN int
nk_do_button_symbol(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect bounds,
    enum nk_symbol_type symbol, enum nk_button_behavior behavior,
    const struct nk_style_button *style, const struct nk_input *in,
    const struct nk_user_font *font)
{
    int ret;
    struct nk_rect content;

    NK_ASSERT(state);
    NK_ASSERT(style);
    NK_ASSERT(font);
    NK_ASSERT(out);
    if (!out || !style || !font || !state)
        return nk_false;

    ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_button_symbol(out, &bounds, &content, *state, style, symbol, font);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return ret;
}